

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Worker::PrepareThread(Worker *this)

{
  bool bVar1;
  shared_ptr<restincurl::Worker::WorkerThread> local_20;
  Worker *local_10;
  Worker *this_local;
  
  local_10 = this;
  bVar1 = std::mutex::try_lock(&this->mutex_);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!mutex_.try_lock()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x312,"void restincurl::Worker::PrepareThread()");
  }
  if (((this->abort_ & 1U) == 0) && ((this->done_ & 1U) == 0)) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->thread_);
    if (!bVar1) {
      std::
      make_shared<restincurl::Worker::WorkerThread,restincurl::Worker::PrepareThread()::_lambda()_1_>
                ((anon_class_8_1_8991fb9c *)&local_20);
      std::shared_ptr<restincurl::Worker::WorkerThread>::operator=(&this->thread_,&local_20);
      std::shared_ptr<restincurl::Worker::WorkerThread>::~shared_ptr(&local_20);
    }
    if (((this->abort_ ^ 0xffU) & 1) == 0) {
      __assert_fail("!abort_",
                    "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                    ,0x326,"void restincurl::Worker::PrepareThread()");
    }
    if (((this->done_ ^ 0xffU) & 1) == 0) {
      __assert_fail("!done_",
                    "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                    ,0x327,"void restincurl::Worker::PrepareThread()");
    }
  }
  return;
}

Assistant:

void PrepareThread() {
            // Must only be called when the mutex_ is acquired!
            assert(!mutex_.try_lock());
            if (abort_ || done_) {
                return;
            }
            if (!thread_) {
                thread_ = std::make_shared<WorkerThread>([&] {
                    try {
                        RESTINCURL_LOG("Starting thread " << std::this_thread::get_id());
                        Init();
                        Run();
                        Clean();
                    } catch (const std::exception& ex) {
                        RESTINCURL_LOG("Worker: " << ex.what());
                    }
                    RESTINCURL_LOG("Exiting thread " << std::this_thread::get_id());

                    lock_t lock(mutex_);
                    thread_.reset();
                });
            }
            assert(!abort_);
            assert(!done_);
        }